

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.hh
# Opt level: O0

void __thiscall tinyusdz::Stage::~Stage(Stage *this)

{
  Stage *this_local;
  
  HandleAllocator<unsigned_long>::~HandleAllocator(&this->_prim_id_allocator);
  ::std::
  map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
  ::~map(&this->_prim_id_cache);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  ::~map(&this->_prim_path_cache);
  ::std::__cxx11::string::~string((string *)&this->_warn);
  ::std::__cxx11::string::~string((string *)&this->_err);
  LayerMetas::~LayerMetas(&this->stage_metas);
  ::std::__cxx11::string::~string((string *)&this->name);
  ::std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~multiset(&this->_root_node_nameSet);
  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector(&this->_root_nodes);
  return;
}

Assistant:

static Stage CreateInMemory() { return Stage(); }